

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O3

size_t __thiscall common::SettingsSpan::negated(SettingsSpan *this)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = this->size;
  if (sVar3 != 0) {
    lVar4 = sVar3 * 0x58;
    do {
      if (*(int *)((long)&this->data[-1].typ + lVar4) == 5) {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&this->data[-1].val._M_dataplus._M_p + lVar4),"1");
        if (iVar2 != 0) goto LAB_0013e9f1;
      }
      sVar3 = sVar3 - 1;
      lVar4 = lVar4 + -0x58;
    } while (sVar3 != 0);
  }
  sVar3 = 0;
LAB_0013e9f1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t SettingsSpan::negated() const
{
    for (size_t i = size; i > 0; --i) {
        if (data[i - 1].isFalse()) return i; // Return number of negated values (position of last false value)
    }
    return 0;
}